

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::AttributeEncodingString(uint Encoding)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  StringRef SVar4;
  
  uVar3 = Encoding - 1;
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (uVar3 < 0x12) {
    pcVar1 = &DAT_00e6f95c + *(int *)(&DAT_00e6f95c + (ulong)uVar3 * 4);
    sVar2 = *(size_t *)(&DAT_00e6f9a8 + (ulong)uVar3 * 8);
  }
  SVar4.Length = sVar2;
  SVar4.Data = pcVar1;
  return SVar4;
}

Assistant:

StringRef llvm::dwarf::AttributeEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  case DW_ATE_##NAME:                                                          \
    return "DW_ATE_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}